

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O0

int rops_adoption_bind_h1(lws *wsi,int type,char *vh_prot_name)

{
  int iVar1;
  lwsi_state state;
  char *vh_prot_name_local;
  int type_local;
  lws *wsi_local;
  
  if ((type & 1U) == 0) {
    wsi_local._4_4_ = 0;
  }
  else if ((((type & 0x1000000U) == 0) || (wsi->role_ops == &role_ops_h1)) ||
          (wsi->role_ops == &role_ops_h2)) {
    if ((type & 0x1000000U) == 0) {
      state = LRS_HEADERS;
      if ((type & 4U) != 0) {
        state = LRS_SSL_INIT;
      }
      lws_role_transition(wsi,0x20000000,state,&role_ops_h1);
      if ((vh_prot_name == (char *)0x0) &&
         ((int)(uint)wsi->vhost->default_protocol_index < wsi->vhost->count_protocols)) {
        wsi->protocol = wsi->vhost->protocols + wsi->vhost->default_protocol_index;
      }
      else {
        wsi->protocol = wsi->vhost->protocols;
      }
      lws_set_timeout(wsi,PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,wsi->context->timeout_secs);
      wsi_local._4_4_ = 1;
    }
    else {
      iVar1 = lws_header_table_attach(wsi,0);
      if (iVar1 == 0) {
        _lws_log(0x10,"Attached ah immediately\n");
      }
      else {
        _lws_log(8,"%s: waiting for ah\n","rops_adoption_bind_h1");
      }
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_adoption_bind_h1(struct lws *wsi, int type, const char *vh_prot_name)
{
	if (!(type & LWS_ADOPT_HTTP))
		return 0; /* no match */

	if (type & _LWS_ADOPT_FINISH && !lwsi_role_http(wsi))
		return 0;

	if (type & _LWS_ADOPT_FINISH) {
		if (!lws_header_table_attach(wsi, 0))
			lwsl_debug("Attached ah immediately\n");
		else
			lwsl_info("%s: waiting for ah\n", __func__);

		return 1;
	}

	lws_role_transition(wsi, LWSIFR_SERVER, (type & LWS_ADOPT_ALLOW_SSL) ?
			    LRS_SSL_INIT : LRS_HEADERS, &role_ops_h1);

	/*
	 * We have to bind to h1 as a default even when we're actually going to
	 * replace it as an h2 bind later.  So don't take this seriously if the
	 * default is disabled (ws upgrade caees properly about it)
	 */

	if (!vh_prot_name && wsi->vhost->default_protocol_index <
			     wsi->vhost->count_protocols)
		wsi->protocol = &wsi->vhost->protocols[
				wsi->vhost->default_protocol_index];
	else
		wsi->protocol = &wsi->vhost->protocols[0];

	/* the transport is accepted... give him time to negotiate */
	lws_set_timeout(wsi, PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,
			wsi->context->timeout_secs);

	return 1; /* bound */
}